

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O3

Test * DepfileParserTestMultipleRulesDifferentOutputs::Create(void)

{
  Test *pTVar1;
  
  pTVar1 = (Test *)operator_new(0x68);
  pTVar1->failed_ = false;
  pTVar1->assertion_failures_ = 0;
  pTVar1->_vptr_Test = (_func_int **)&PTR__DepfileParserTest_001d2980;
  DepfileParser::DepfileParser((DepfileParser *)(pTVar1 + 1));
  *(bool **)&pTVar1[4].failed_ = &pTVar1[5].failed_;
  pTVar1[5]._vptr_Test = (_func_int **)0x0;
  pTVar1[5].failed_ = false;
  pTVar1->_vptr_Test = (_func_int **)&PTR__DepfileParserTest_001d28c8;
  g_current_test = pTVar1;
  return pTVar1;
}

Assistant:

TEST_F(DepfileParserTest, MultipleRulesDifferentOutputs) {
  // check that multiple different outputs are accepted by the parser
  // when spread across multiple rules
  string err;
  EXPECT_TRUE(Parse("foo: x y\n"
                    "bar: y z\n", &err));
  ASSERT_EQ(2u, parser_.outs_.size());
  ASSERT_EQ("foo", parser_.outs_[0].AsString());
  ASSERT_EQ("bar", parser_.outs_[1].AsString());
  ASSERT_EQ(3u, parser_.ins_.size());
  EXPECT_EQ("x", parser_.ins_[0].AsString());
  EXPECT_EQ("y", parser_.ins_[1].AsString());
  EXPECT_EQ("z", parser_.ins_[2].AsString());
}